

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O0

mpt_metatype * mpt_iterator_poly(char *desc,mpt_array *base)

{
  mpt_buffer *pmVar1;
  int iVar2;
  uintptr_t uVar3;
  int *piVar4;
  char *pcVar5;
  ssize_t len_1;
  int max;
  ssize_t len;
  int ns;
  int nc;
  coeff_poly coeff [128];
  mpt_buffer *buf;
  mpt_iteratorPolynom *data;
  mpt_array *base_local;
  char *desc_local;
  
  len._4_4_ = 0;
  pmVar1 = base->_buf;
  if ((pmVar1 == (mpt_buffer *)0x0) || (uVar3 = (*pmVar1->_vptr->addref)(pmVar1), uVar3 != 0)) {
    base_local = (mpt_array *)desc;
    if (desc != (char *)0x0) {
      do {
        iVar2 = mpt_cdouble(coeff + len._4_4_,base_local,0);
        if ((long)iVar2 < 1) {
          if (len._4_4_ == 0) {
            if (pmVar1 != (mpt_buffer *)0x0) {
              (*pmVar1->_vptr->unref)(pmVar1);
            }
            piVar4 = __errno_location();
            *piVar4 = 0x16;
            return (mpt_metatype *)0x0;
          }
          break;
        }
        base_local = (mpt_array *)((long)&base_local->_buf + (long)iVar2);
        len._4_4_ = len._4_4_ + 1;
      } while (len._4_4_ < 0x80);
    }
    len._0_4_ = 0;
    if ((len._4_4_ != 0) && (pcVar5 = strchr((char *)base_local,0x3a), pcVar5 != (char *)0x0)) {
      base_local = (mpt_array *)(pcVar5 + 1);
      for (; (int)len < len._4_4_ + -1; len._0_4_ = (int)len + 1) {
        iVar2 = mpt_cdouble(&ns + (long)(int)len * 4,base_local,0);
        if ((long)iVar2 < 1) break;
        base_local = (mpt_array *)((long)&base_local->_buf + (long)iVar2);
      }
    }
    for (; (int)len < len._4_4_; len._0_4_ = (int)len + 1) {
      (&ns + (long)(int)len * 4)[0] = 0;
      (&ns + (long)(int)len * 4)[1] = 0;
    }
    desc_local = (char *)malloc((long)len._4_4_ * 0x10 + 0x40);
    if (desc_local == (char *)0x0) {
      if (pmVar1 != (mpt_buffer *)0x0) {
        (*pmVar1->_vptr->unref)(pmVar1);
      }
      desc_local = (char *)0x0;
    }
    else {
      *(_mpt_vptr_metatype **)desc_local = &mpt_iterator_poly::polyMeta;
      *(_mpt_vptr_iterator **)(desc_local + 8) = &mpt_iterator_poly::polyIter;
      desc_local[0x10] = '\0';
      desc_local[0x11] = '\0';
      desc_local[0x12] = '\0';
      desc_local[0x13] = '\0';
      desc_local[0x14] = '\0';
      desc_local[0x15] = '\0';
      desc_local[0x16] = '\0';
      desc_local[0x17] = '\0';
      desc_local[0x18] = '\0';
      desc_local[0x19] = '\0';
      desc_local[0x1a] = '\0';
      desc_local[0x1b] = '\0';
      desc_local[0x1c] = '\0';
      desc_local[0x1d] = '\0';
      desc_local[0x1e] = '\0';
      desc_local[0x1f] = '\0';
      *(mpt_buffer **)(desc_local + 0x28) = pmVar1;
      desc_local[0x30] = '\0';
      desc_local[0x31] = '\0';
      desc_local[0x32] = '\0';
      desc_local[0x33] = '\0';
      desc_local[0x34] = '\0';
      desc_local[0x35] = '\0';
      desc_local[0x36] = '\0';
      desc_local[0x37] = '\0';
      *(int *)(desc_local + 0x38) = len._4_4_;
      memcpy(desc_local + 0x40,&ns,(long)len._4_4_ << 4);
    }
  }
  else {
    desc_local = (char *)0x0;
  }
  return (mpt_metatype *)desc_local;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_poly(const char *desc, const _MPT_ARRAY_TYPE(double) *base)
{
	static const MPT_INTERFACE_VPTR(metatype) polyMeta = {
		{ iterPolyConv },
		iterPolyUnref,
		iterPolyRef,
		iterPolyClone
	};
	static const MPT_INTERFACE_VPTR(iterator) polyIter = {
		iterPolyValue,
		iterPolyAdvance,
		iterPolyReset
	};
	MPT_STRUCT(iteratorPolynom) *data;
	MPT_STRUCT(buffer) *buf;
	struct coeff_poly coeff[128];
	int nc = 0, ns = sizeof(coeff)/sizeof(*coeff);
	
	if ((buf = base->_buf)
	    && !buf->_vptr->addref(buf)) {
		return 0;
	}
	/* polynom coefficients */
	if (desc) {
		do {
			ssize_t len = mpt_cdouble(&coeff[nc].mult, desc, 0);
			
			if (len <= 0) {
				if (!nc) {
					if (buf) {
						buf->_vptr->unref(buf);
					}
					errno = EINVAL;
					return 0;
				}
				break;
			}
			desc += len;
		} while (++nc < ns);
	}
	/* variable shift */
	ns = 0;
	if (nc && (desc = strchr(desc, ':'))) {
		int max = nc - 1;
		++desc;
		while (ns < max) {
			ssize_t len = mpt_cdouble(&coeff[ns].shift, desc, 0);
			
			if (len <= 0) {
				break;
			}
			desc += len;
			++ns;
		}
	}
	for ( ; ns < nc; ++ns) {
		coeff[ns].shift = 0;
	}
	if (!(data = malloc(sizeof(*data) + nc * sizeof(*coeff)))) {
		if (buf) {
			buf->_vptr->unref(buf);
		}
		return 0;
	}
	data->_mt._vptr = &polyMeta;
	data->_it._vptr = &polyIter;
	
	MPT_value_set(&data->val, 0, 0);
	
	data->grid._buf = buf;
	data->pos = 0;
	data->coeff = nc;
	memcpy(data + 1, coeff, nc * sizeof(*coeff));
	
	return &data->_mt;
}